

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::RepeatedFieldHelper<15>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  int *piVar1;
  int *piVar2;
  int index;
  RepeatedField<int> *array;
  uint32_t local_2c;
  
  if (0 < *field) {
    index = 0;
    do {
      local_2c = md->tag;
      OutputHelper<google::protobuf::internal::ArrayOutput,_13>::Serialize(&local_2c,output);
      piVar2 = RepeatedField<int>::Get((RepeatedField<int> *)field,index);
      piVar1 = (int *)output->ptr;
      *piVar1 = *piVar2;
      output->ptr = (uint8_t *)(piVar1 + 1);
      index = index + 1;
    } while (index < *field);
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    for (int i = 0; i < array.size(); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<type>(&array[i], output);
    }
  }